

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sectoraction.cpp
# Opt level: O2

bool __thiscall
ASecActEyesSurface::DoTriggerAction(ASecActEyesSurface *this,AActor *triggerer,int activationType)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = false;
  if ((char)activationType < '\0') {
    bVar1 = ASectorAction::CheckTrigger(&this->super_ASectorAction,triggerer);
  }
  bVar2 = ASectorAction::DoTriggerAction(&this->super_ASectorAction,triggerer,activationType);
  return (bool)(bVar2 | bVar1);
}

Assistant:

bool ASecActEyesSurface::DoTriggerAction (AActor *triggerer, int activationType)
{
	bool didit = (activationType & SECSPAC_EyesSurface) ? CheckTrigger (triggerer) : false;
	return didit | Super::DoTriggerAction (triggerer, activationType);
}